

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  ulong uVar1;
  ulong uVar2;
  xml_allocator *this;
  size_t sVar3;
  undefined2 *puVar4;
  char *pcVar5;
  bool bVar6;
  xml_memory_page *local_38;
  
  if (source_length == 0) {
    if ((*header & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string
                (*(xml_allocator **)((long)header - (*header >> 8)),*dest);
    }
    *dest = (char *)0x0;
    *header = *header & ~header_mask;
    return true;
  }
  pcVar5 = *dest;
  if ((pcVar5 == (char *)0x0) || (uVar2 = *header, (uVar2 & 0x40) != 0)) {
LAB_001565ee:
    this = *(xml_allocator **)((long)header - (*header >> 8));
    uVar1 = source_length + 0xc;
    uVar2 = this->_busy_size + (uVar1 & 0xfffffffffffffff8);
    if (uVar2 < 0x7fd9) {
      local_38 = this->_root;
      puVar4 = (undefined2 *)((long)&local_38[1].allocator + this->_busy_size);
      this->_busy_size = uVar2;
    }
    else {
      puVar4 = (undefined2 *)
               anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this,uVar1 & 0xfffffffffffffff8,&local_38);
    }
    pcVar5 = (char *)0x0;
    if (puVar4 != (undefined2 *)0x0) {
      if (uVar1 < 0x80000) {
        pcVar5 = (char *)(uVar1 >> 3 & 0x1fffffff);
      }
      *puVar4 = (short)(((int)puVar4 - (int)local_38) + 0x7ffd8U >> 3);
      puVar4[1] = (short)pcVar5;
      pcVar5 = (char *)(puVar4 + 2);
    }
    if (pcVar5 == (char *)0x0) {
      return pcVar5 != (char *)0x0;
    }
    memcpy(pcVar5,source,source_length);
    pcVar5[source_length] = '\0';
    if ((*header & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string(this,*dest);
    }
    *dest = pcVar5;
    *header = *header | header_mask;
  }
  else {
    sVar3 = strlen(pcVar5);
    if ((uVar2 & header_mask) == 0) {
      bVar6 = source_length <= sVar3;
LAB_001565ca:
      if (!bVar6) goto LAB_001565ee;
    }
    else {
      if (sVar3 < source_length) goto LAB_001565ee;
      if (0x1f < sVar3) {
        bVar6 = sVar3 - source_length < sVar3 >> 1;
        goto LAB_001565ca;
      }
    }
    memcpy(pcVar5,source,source_length);
    (*dest)[source_length] = '\0';
  }
  return true;
}

Assistant:

PUGI_IMPL_FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		assert((header & header_mask) == 0 || dest); // header bit indicates whether dest was previously allocated

		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = NULL;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}